

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ground_plane.cpp
# Opt level: O2

double __thiscall ON_GroundPlane::CImpl::Altitude(CImpl *this)

{
  double dVar1;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  
  ::ON_XMLVariant::ON_XMLVariant(&local_108,0.0);
  ON_InternalXMLImpl::GetParameter
            (&local_200,&this->super_ON_InternalXMLImpl,
             L"render-content-manager-document/settings/ground-plane",L"altitude",&local_108);
  dVar1 = ::ON_XMLVariant::AsDouble(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  return dVar1;
}

Assistant:

double Altitude(void)            const { return GetParameter(XMLPath(), ON_RDK_GP_ALTITUDE, 0.0).AsDouble(); }